

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O1

int mapEndBiome(EndNoise *en,int *out,int x,int z,int w,int h)

{
  long lVar1;
  double dVar2;
  uint uVar3;
  short sVar4;
  void *__ptr;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  void *pvVar13;
  long lVar14;
  long lVar15;
  ushort *puVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  long local_a0;
  ulong local_98;
  int local_48;
  
  lVar15 = (long)(w + 0x1a);
  __ptr = malloc(lVar15 * (h + 0x1a) * 2);
  lVar5 = (long)x;
  lVar6 = (long)z;
  lVar7 = (long)w;
  if (-0x1a < h) {
    lVar12 = 0;
    pvVar13 = __ptr;
    do {
      if (-0x1a < w) {
        lVar14 = lVar6 + -0xc + lVar12;
        lVar19 = 0;
        do {
          lVar1 = lVar5 + -0xc + lVar19;
          if (((ulong)(lVar1 * lVar1 + lVar14 * lVar14) < 0x1001) ||
             (dVar2 = sampleSimplex2D(&en->perlin,(double)lVar1,(double)lVar14),
             -0.8999999761581421 <= dVar2)) {
            sVar4 = 0;
          }
          else {
            uVar8 = (ulong)(ABS((float)lVar1) * 3439.0 + ABS((float)lVar14) * 147.0);
            uVar11 = uVar8 & 0xffffffff;
            sVar4 = ((short)uVar8 - ((short)(uVar11 / 0xd) + (short)(uVar11 / 0xd) * 0xc)) + 9;
            sVar4 = sVar4 * sVar4;
          }
          *(short *)((long)pvVar13 + lVar19 * 2) = sVar4;
          lVar19 = lVar19 + 1;
        } while (lVar15 != lVar19);
      }
      lVar12 = lVar12 + 1;
      pvVar13 = (void *)((long)pvVar13 + lVar7 * 2 + 0x34);
    } while (lVar12 != h + 0x1a);
  }
  if (0 < h) {
    local_98 = lVar6 * 2;
    local_a0 = 0;
    do {
      if (0 < w) {
        lVar12 = local_a0 + lVar6;
        uVar3 = (int)lVar12 * 2 + 1;
        local_48 = uVar3 * uVar3;
        uVar9 = -uVar3;
        if (0 < (int)uVar3) {
          uVar9 = uVar3;
        }
        lVar14 = 0;
        do {
          lVar19 = lVar5 + lVar14;
          iVar10 = 9;
          if (0x1000 < (ulong)(lVar19 * lVar19 + lVar12 * lVar12)) {
            lVar1 = lVar19 * 2 + 1;
            uVar22 = (uint)lVar1;
            if ((en->mc < 0x11) || (iVar10 = 0x2b, -1 < (int)(uVar22 * uVar22 + local_48))) {
              uVar8 = (ulong)((uint)((int)lVar19 * 2) >> 0x1f);
              uVar20 = -uVar22;
              if (0 < (int)uVar22) {
                uVar20 = uVar22;
              }
              uVar22 = (uVar22 * uVar22 + uVar3 * uVar3) * 0x40;
              if (0xf < uVar9) {
                uVar22 = 0x3841;
              }
              if (0xf < uVar20) {
                uVar22 = 0x3841;
              }
              puVar16 = (ushort *)
                        ((long)__ptr +
                        (lVar1 - (lVar1 >> 0x3f) & 0xfffffffffffffffeU) +
                        (((lVar12 * 2 - (lVar12 * 2 >> 0x3f)) + 1 >> 1) - lVar6) * lVar15 * 2 +
                        lVar5 * -2 + 0x30);
              lVar19 = 0;
              do {
                uVar17 = (uint)*(ushort *)
                                (&DAT_00187760 + (ulong)((uint)(local_98 >> 0x1e) & 2) + lVar19 * 2)
                ;
                uVar20 = uVar22;
                if ((puVar16[-0x18] != 0) &&
                   (uVar20 = (*(ushort *)(&DAT_00187760 + uVar8 * 2) + uVar17) *
                             (uint)puVar16[-0x18], uVar22 <= uVar20)) {
                  uVar20 = uVar22;
                }
                uVar22 = uVar20;
                if ((puVar16[-0x17] != 0) &&
                   (uVar22 = (*(ushort *)(&DAT_00187762 + uVar8 * 2) + uVar17) *
                             (uint)puVar16[-0x17], uVar20 <= uVar22)) {
                  uVar22 = uVar20;
                }
                uVar20 = uVar22;
                if ((puVar16[-0x16] != 0) &&
                   (uVar20 = (*(ushort *)(&DAT_00187764 + uVar8 * 2) + uVar17) *
                             (uint)puVar16[-0x16], uVar22 <= uVar20)) {
                  uVar20 = uVar22;
                }
                uVar22 = uVar20;
                if ((puVar16[-0x15] != 0) &&
                   (uVar22 = (*(ushort *)(&DAT_00187766 + uVar8 * 2) + uVar17) *
                             (uint)puVar16[-0x15], uVar20 <= uVar22)) {
                  uVar22 = uVar20;
                }
                uVar20 = uVar22;
                if ((puVar16[-0x14] != 0) &&
                   (uVar20 = (*(ushort *)(&DAT_00187768 + uVar8 * 2) + uVar17) *
                             (uint)puVar16[-0x14], uVar22 <= uVar20)) {
                  uVar20 = uVar22;
                }
                uVar22 = uVar20;
                if ((puVar16[-0x13] != 0) &&
                   (uVar22 = (*(ushort *)(&DAT_0018776a + uVar8 * 2) + uVar17) *
                             (uint)puVar16[-0x13], uVar20 <= uVar22)) {
                  uVar22 = uVar20;
                }
                uVar20 = uVar22;
                if ((puVar16[-0x12] != 0) &&
                   (uVar20 = (*(ushort *)(&DAT_0018776c + uVar8 * 2) + uVar17) *
                             (uint)puVar16[-0x12], uVar22 <= uVar20)) {
                  uVar20 = uVar22;
                }
                uVar22 = uVar20;
                if ((puVar16[-0x11] != 0) &&
                   (uVar22 = (*(ushort *)(&DAT_0018776e + uVar8 * 2) + uVar17) *
                             (uint)puVar16[-0x11], uVar20 <= uVar22)) {
                  uVar22 = uVar20;
                }
                uVar18 = (uint)*(ushort *)
                                (&DAT_00187760 + (ulong)((uint)(local_98 >> 0x1e) & 2) + lVar19 * 2)
                ;
                uVar20 = uVar22;
                if ((puVar16[-0x10] != 0) &&
                   (uVar20 = (*(ushort *)(&DAT_00187770 + uVar8 * 2) + uVar18) *
                             (uint)puVar16[-0x10], uVar22 <= uVar20)) {
                  uVar20 = uVar22;
                }
                uVar22 = uVar20;
                if ((puVar16[-0xf] != 0) &&
                   (uVar22 = (*(ushort *)(&DAT_00187772 + uVar8 * 2) + uVar18) * (uint)puVar16[-0xf]
                   , uVar20 <= uVar22)) {
                  uVar22 = uVar20;
                }
                uVar20 = uVar22;
                if ((puVar16[-0xe] != 0) &&
                   (uVar20 = (*(ushort *)(&DAT_00187774 + uVar8 * 2) + uVar18) * (uint)puVar16[-0xe]
                   , uVar22 <= uVar20)) {
                  uVar20 = uVar22;
                }
                uVar22 = uVar20;
                if ((puVar16[-0xd] != 0) &&
                   (uVar22 = (*(ushort *)(&DAT_00187776 + uVar8 * 2) + uVar18) * (uint)puVar16[-0xd]
                   , uVar20 <= uVar22)) {
                  uVar22 = uVar20;
                }
                uVar20 = uVar22;
                if ((puVar16[-0xc] != 0) &&
                   (uVar20 = (*(ushort *)(&DAT_00187778 + uVar8 * 2) + uVar18) * (uint)puVar16[-0xc]
                   , uVar22 <= uVar20)) {
                  uVar20 = uVar22;
                }
                uVar22 = uVar20;
                if ((puVar16[-0xb] != 0) &&
                   (uVar22 = (*(ushort *)(&DAT_0018777a + uVar8 * 2) + uVar18) * (uint)puVar16[-0xb]
                   , uVar20 <= uVar22)) {
                  uVar22 = uVar20;
                }
                uVar20 = uVar22;
                if ((puVar16[-10] != 0) &&
                   (uVar20 = (*(ushort *)(&DAT_0018777c + uVar8 * 2) + uVar18) * (uint)puVar16[-10],
                   uVar22 <= uVar20)) {
                  uVar20 = uVar22;
                }
                uVar22 = uVar20;
                if ((puVar16[-9] != 0) &&
                   (uVar22 = (*(ushort *)(&DAT_0018777e + uVar8 * 2) + uVar18) * (uint)puVar16[-9],
                   uVar20 <= uVar22)) {
                  uVar22 = uVar20;
                }
                uVar20 = uVar22;
                if ((puVar16[-8] != 0) &&
                   (uVar20 = (*(ushort *)(&DAT_00187780 + uVar8 * 2) + uVar18) * (uint)puVar16[-8],
                   uVar22 <= uVar20)) {
                  uVar20 = uVar22;
                }
                uVar22 = uVar20;
                if ((puVar16[-7] != 0) &&
                   (uVar22 = (*(ushort *)(&DAT_00187782 + uVar8 * 2) + uVar18) * (uint)puVar16[-7],
                   uVar20 <= uVar22)) {
                  uVar22 = uVar20;
                }
                uVar20 = uVar22;
                if ((puVar16[-6] != 0) &&
                   (uVar20 = (*(ushort *)(&DAT_00187784 + uVar8 * 2) + uVar18) * (uint)puVar16[-6],
                   uVar22 <= uVar20)) {
                  uVar20 = uVar22;
                }
                uVar22 = uVar20;
                if ((puVar16[-5] != 0) &&
                   (uVar22 = (*(ushort *)(&DAT_00187786 + uVar8 * 2) + uVar18) * (uint)puVar16[-5],
                   uVar20 <= uVar22)) {
                  uVar22 = uVar20;
                }
                uVar20 = uVar22;
                if ((puVar16[-4] != 0) &&
                   (uVar20 = (*(ushort *)(&DAT_00187788 + uVar8 * 2) + uVar18) * (uint)puVar16[-4],
                   uVar22 <= uVar20)) {
                  uVar20 = uVar22;
                }
                uVar22 = uVar20;
                if ((puVar16[-3] != 0) &&
                   (uVar22 = (*(ushort *)(&DAT_0018778a + uVar8 * 2) + uVar18) * (uint)puVar16[-3],
                   uVar20 <= uVar22)) {
                  uVar22 = uVar20;
                }
                uVar20 = uVar22;
                if ((puVar16[-2] != 0) &&
                   (uVar20 = (*(ushort *)(&DAT_0018778c + uVar8 * 2) + uVar18) * (uint)puVar16[-2],
                   uVar22 <= uVar20)) {
                  uVar20 = uVar22;
                }
                uVar21 = uVar20;
                if ((puVar16[-1] != 0) &&
                   (uVar21 = (*(ushort *)(&DAT_0018778e + uVar8 * 2) + uVar18) * (uint)puVar16[-1],
                   uVar20 <= uVar21)) {
                  uVar21 = uVar20;
                }
                uVar22 = uVar21;
                if ((*puVar16 != 0) &&
                   (uVar22 = (*(ushort *)(&DAT_00187790 + uVar8 * 2) + uVar17) * (uint)*puVar16,
                   uVar21 <= uVar22)) {
                  uVar22 = uVar21;
                }
                lVar19 = lVar19 + 1;
                puVar16 = puVar16 + lVar7 + 0x1a;
              } while (lVar19 != 0x19);
              iVar10 = 0x2a;
              if ((0xe0f < uVar22) && (iVar10 = 0x29, 10000 < uVar22)) {
                iVar10 = (uint)(uVar22 < 0x3841) * 3 + 0x28;
              }
            }
          }
          out[local_a0 * lVar7 + lVar14] = iVar10;
          lVar14 = lVar14 + 1;
        } while (lVar14 != lVar7);
      }
      local_a0 = local_a0 + 1;
      local_98 = local_98 + 2;
    } while (local_a0 != h);
  }
  free(__ptr);
  return 0;
}

Assistant:

int mapEndBiome(const EndNoise *en, int *out, int x, int z, int w, int h)
{
    int64_t i, j;
    int64_t hw = w + 26;
    int64_t hh = h + 26;
    uint16_t *hmap = (uint16_t*) malloc(sizeof(*hmap) * hw * hh);

    for (j = 0; j < hh; j++)
    {
        for (i = 0; i < hw; i++)
        {
            int64_t rx = x + i - 12;
            int64_t rz = z + j - 12;
            uint64_t rsq = rx * rx + rz * rz;
            uint16_t v = 0;
            if (rsq > 4096 && sampleSimplex2D(&en->perlin, rx, rz) < -0.9f)
            {
                //v = (llabs(rx) * 3439 + llabs(rz) * 147) % 13 + 9;
                v = (unsigned int)(
                        fabsf((float)rx) * 3439.0f + fabsf((float)rz) * 147.0f
                    ) % 13 + 9;
                v *= v;
            }
            hmap[(int64_t)j*hw+i] = v;
        }
    }

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int64_t hx = (i+x);
            int64_t hz = (j+z);
            uint64_t rsq = hx * hx + hz * hz;

            if (rsq <= 4096L)
                out[j*w+i] = the_end;
            else
            {
                hx = 2*hx + 1;
                hz = 2*hz + 1;
                if (en->mc > MC_1_13)
                {   // add outer end rings
                    rsq = hx * hx + hz * hz;
                    if ((int)rsq < 0)
                    {
                        out[j*w+i] = end_barrens;
                        continue;
                    }
                }
                uint16_t *p_elev = &hmap[(hz/2-z)*hw + (hx/2-x)];
                out[j*w+i] = getEndBiome(hx, hz, p_elev, hw);
            }
        }
    }

    free(hmap);
    return 0;
}